

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSExporter::Discreet3DSExporter
          (Discreet3DSExporter *this,shared_ptr<Assimp::IOStream> *outfile,aiScene *scene)

{
  undefined1 local_80 [8];
  ChunkWriter chunk_3;
  ChunkWriter chunk_2;
  ChunkWriter chunk_1;
  ChunkWriter chunk;
  shared_ptr<Assimp::IOStream> local_30;
  aiScene *local_20;
  aiScene *scene_local;
  shared_ptr<Assimp::IOStream> *outfile_local;
  Discreet3DSExporter *this_local;
  
  this->scene = scene;
  local_20 = scene;
  scene_local = (aiScene *)outfile;
  outfile_local = (shared_ptr<Assimp::IOStream> *)this;
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_30,outfile);
  StreamWriter<false,_false>::StreamWriter(&this->writer,&local_30,false);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_30);
  std::
  map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
  ::map(&this->trafos);
  std::
  multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
  ::multimap(&this->meshes);
  anon_unknown_0::CollectTrafos(local_20->mRootNode,&this->trafos);
  anon_unknown_0::CollectMeshes(local_20->mRootNode,&this->meshes);
  anon_unknown_0::ChunkWriter::ChunkWriter
            ((ChunkWriter *)&chunk_1.chunk_start_pos,&this->writer,0x4d4d);
  anon_unknown_0::ChunkWriter::ChunkWriter
            ((ChunkWriter *)&chunk_2.chunk_start_pos,&this->writer,0x3d3d);
  WriteMaterials(this);
  WriteMeshes(this);
  anon_unknown_0::ChunkWriter::ChunkWriter
            ((ChunkWriter *)&chunk_3.chunk_start_pos,&this->writer,0x100);
  StreamWriter<false,_false>::PutF4(&this->writer,1.0);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&chunk_3.chunk_start_pos);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&chunk_2.chunk_start_pos);
  anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)local_80,&this->writer,0xb000);
  WriteHierarchy(this,local_20->mRootNode,-1,-1);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)local_80);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&chunk_1.chunk_start_pos);
  return;
}

Assistant:

Discreet3DSExporter:: Discreet3DSExporter(std::shared_ptr<IOStream> &outfile, const aiScene* scene)
: scene(scene)
, writer(outfile)
{
    CollectTrafos(scene->mRootNode, trafos);
    CollectMeshes(scene->mRootNode, meshes);

    ChunkWriter chunk(writer, Discreet3DS::CHUNK_MAIN);

    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_OBJMESH);
        WriteMaterials();
        WriteMeshes();

        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_MASTER_SCALE);
            writer.PutF4(1.0f);
        }
    }

    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_KEYFRAMER);
        WriteHierarchy(*scene->mRootNode, -1, -1);
    }
}